

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::Clear(ExtensionSet *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  iterator iter;
  ExtensionSet *this_local;
  
  iter._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::begin(&this->extensions_);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
         ::end(&this->extensions_);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_18);
    Extension::Clear(&ppVar2->second);
    std::
    _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>::
    operator++(&local_18);
  }
  return;
}

Assistant:

void ExtensionSet::Clear() {
  for (map<int, Extension>::iterator iter = extensions_.begin();
       iter != extensions_.end(); ++iter) {
    iter->second.Clear();
  }
}